

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_logger_fct.h
# Opt level: O0

void custlog__on_test_suite_end(fct_logger_i *l,fct_logger_evt_t *e)

{
  fct_ts_t *ts;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  double dVar4;
  int failed_test_cnt;
  int passed_test_cnt;
  int test_cnt;
  fct_ts_t *test_suite;
  fct_logger_evt_t *e_local;
  fct_logger_i *l_local;
  
  ts = e->ts;
  sVar1 = fct_ts__tst_cnt(ts);
  sVar2 = fct_ts__tst_cnt(ts);
  dVar4 = fct_ts__duration(ts);
  sVar3 = fct_ts__chk_cnt(ts);
  printf("on_test_suite_end:\n    -          name: %s\n    -      duration: %f ms\n    -  tests passed: %d\n    -  tests failed: %d\n    -        checks: %lu\n"
         ,dVar4,ts->name,sVar2 & 0xffffffff,(ulong)(uint)((int)sVar1 - (int)sVar2),sVar3);
  return;
}

Assistant:

static void
custlog__on_test_suite_end(fct_logger_i *l, fct_logger_evt_t const *e)
{
    fct_ts_t const *test_suite = e->ts;
    int test_cnt = fct_ts__tst_cnt(test_suite);
    int passed_test_cnt = fct_ts__tst_cnt(test_suite);
    int failed_test_cnt = test_cnt - passed_test_cnt;
    (void)l;
    printf("on_test_suite_end:\n"
           "    -          name: %s\n"
           "    -      duration: %f ms\n"
           "    -  tests passed: %d\n"
           "    -  tests failed: %d\n"
           "    -        checks: %lu\n",
           fct_ts__name(test_suite),
           fct_ts__duration(test_suite),
           passed_test_cnt,
           failed_test_cnt,
           (unsigned long) fct_ts__chk_cnt(test_suite)
          );
}